

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.h
# Opt level: O0

StringVector * __thiscall
CoreML::Specification::OneHotEncoder::mutable_stringcategories(OneHotEncoder *this)

{
  bool bVar1;
  StringVector *this_00;
  OneHotEncoder *this_local;
  
  bVar1 = has_stringcategories(this);
  if (!bVar1) {
    clear_CategoryType(this);
    set_has_stringcategories(this);
    this_00 = (StringVector *)operator_new(0x30);
    StringVector::StringVector(this_00);
    (this->CategoryType_).stringcategories_ = this_00;
  }
  return (this->CategoryType_).stringcategories_;
}

Assistant:

inline ::CoreML::Specification::StringVector* OneHotEncoder::mutable_stringcategories() {
  if (!has_stringcategories()) {
    clear_CategoryType();
    set_has_stringcategories();
    CategoryType_.stringcategories_ = new ::CoreML::Specification::StringVector;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.OneHotEncoder.stringCategories)
  return CategoryType_.stringcategories_;
}